

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_thread.h
# Opt level: O2

void __thiscall
swrenderer::DrawFuzzColumnPalCommand::DrawFuzzColumnPalCommand(DrawFuzzColumnPalCommand *this)

{
  int iVar1;
  uint8_t *puVar2;
  
  puVar2 = drawerargs::dc_destorg;
  iVar1 = drawerargs::dc_pitch;
  (this->super_DrawerCommand)._dest_y =
       (int)((drawerargs::dc_dest - (long)drawerargs::dc_destorg) / (long)drawerargs::dc_pitch);
  (this->super_DrawerCommand)._vptr_DrawerCommand = (_func_int **)&PTR__DrawerCommand_006e4da8;
  *(undefined4 *)&(this->super_DrawerCommand).field_0xc = drawerargs::dc_yl;
  this->_yh = drawerargs::dc_yh;
  this->_x = drawerargs::dc_x;
  this->_destorg = puVar2;
  this->_pitch = iVar1;
  this->_fuzzpos = fuzzpos;
  this->_fuzzviewheight = fuzzviewheight;
  return;
}

Assistant:

DrawerCommand()
	{
		_dest_y = static_cast<int>((swrenderer::drawerargs::dc_dest - swrenderer::drawerargs::dc_destorg) / (swrenderer::drawerargs::dc_pitch));
	}